

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxDoWhileLoop::Emit(FxDoWhileLoop *this,VMFunctionBuilder *build)

{
  BYTE BVar1;
  int iVar2;
  size_t sVar3;
  size_t loopstart;
  size_t loc;
  ExpEmit EVar4;
  FScriptPosition *other;
  bool bVar5;
  TArray<unsigned_long,_unsigned_long> yes;
  TArray<unsigned_long,_unsigned_long> no;
  undefined1 local_58 [8];
  FString FStack_50;
  TArray<unsigned_long,_unsigned_long> local_48;
  
  if (this->Condition->ValueType == (PType *)TypeBool) {
    sVar3 = VMFunctionBuilder::GetAddress(build);
    if (this->Code != (FxExpression *)0x0) {
      FxExpression::EmitStatement(this->Code,build);
    }
    loopstart = VMFunctionBuilder::GetAddress(build);
    iVar2 = (*this->Condition->_vptr_FxExpression[3])();
    if ((char)iVar2 == '\0') {
      local_58 = (undefined1  [8])0x0;
      FStack_50.Chars = (char *)0x0;
      local_48.Array = (unsigned_long *)0x0;
      local_48.Most = 0;
      local_48.Count = 0;
      (*this->Condition->_vptr_FxExpression[10])(this->Condition,build,1);
      VMFunctionBuilder::BackpatchList(build,&local_48,sVar3);
      VMFunctionBuilder::BackpatchListToHere(build,(TArray<unsigned_long,_unsigned_long> *)local_58)
      ;
      TArray<unsigned_long,_unsigned_long>::~TArray(&local_48);
      TArray<unsigned_long,_unsigned_long>::~TArray
                ((TArray<unsigned_long,_unsigned_long> *)local_58);
    }
    else {
      local_58 = (undefined1  [8])this->Condition[1]._vptr_FxExpression;
      other = &this->Condition[1].ScriptPosition;
      if (local_58 == (undefined1  [8])TypeString) {
        FString::AttachToOther(&FStack_50,&other->FileName);
      }
      else {
        FStack_50.Chars = (other->FileName).Chars;
      }
      BVar1 = (((PBasicType *)local_58)->super_PType).RegType;
      if (BVar1 == '\x01') {
        bVar5 = (double)FStack_50.Chars != 0.0;
      }
      else if (BVar1 == '\0') {
        bVar5 = (uint)FStack_50.Chars != 0;
      }
      else {
        bVar5 = false;
      }
      if (local_58 == (undefined1  [8])TypeString) {
        FString::~FString(&FStack_50);
      }
      if (bVar5) {
        loc = VMFunctionBuilder::Emit(build,0x44,0);
        VMFunctionBuilder::Backpatch(build,loc,sVar3);
      }
    }
    sVar3 = VMFunctionBuilder::GetAddress(build);
    FxLoopStatement::Backpatch(&this->super_FxLoopStatement,build,loopstart,sVar3);
    EVar4.RegNum = 0;
    EVar4.RegType = 0x80;
    EVar4.RegCount = '\x01';
    EVar4.Konst = false;
    EVar4.Fixed = false;
    EVar4.Final = false;
    EVar4.Target = false;
    return EVar4;
  }
  __assert_fail("Condition->ValueType == TypeBool",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x23cf,"virtual ExpEmit FxDoWhileLoop::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxDoWhileLoop::Emit(VMFunctionBuilder *build)
{
	assert(Condition->ValueType == TypeBool);

	size_t loopstart, loopend;
	size_t codestart;

	// Execute the loop's content.
	codestart = build->GetAddress();
	if (Code != nullptr)
	{
		Code->EmitStatement(build);
	}

	// Evaluate the condition and execute/break out of the loop.
	loopstart = build->GetAddress();
	if (!Condition->isConstant())
	{
		TArray<size_t> yes, no;
		Condition->EmitCompare(build, true, yes, no);
		build->BackpatchList(no, codestart);
		build->BackpatchListToHere(yes);
	}
	else if (static_cast<FxConstant *>(Condition)->GetValue().GetBool() == true)
	{ // Always looping
		build->Backpatch(build->Emit(OP_JMP, 0), codestart);
	}
	loopend = build->GetAddress();
	Backpatch(build, loopstart, loopend);

	return ExpEmit();
}